

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int cvRcheck3(CVodeMem cv_mem)

{
  uint uVar1;
  int *piVar2;
  sunrealtype *psVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  sunrealtype *psVar17;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  iVar7 = cv_mem->cv_taskc;
  if (iVar7 == 2) {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0]);
    iVar7 = cv_mem->cv_taskc;
  }
  if (iVar7 == 1) {
    dVar19 = cv_mem->cv_toutc;
    if (0.0 <= (dVar19 - cv_mem->cv_tn) * cv_mem->cv_h) {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],cv_mem->cv_y);
    }
    else {
      cv_mem->cv_thi = dVar19;
      CVodeGetDky(cv_mem,dVar19,0,cv_mem->cv_y);
    }
  }
  iVar7 = (*cv_mem->cv_gfun)(cv_mem->cv_thi,cv_mem->cv_y,cv_mem->cv_ghi,cv_mem->cv_user_data);
  cv_mem->cv_nge = cv_mem->cv_nge + 1;
  if (iVar7 != 0) {
    return -0xc;
  }
  dVar19 = (ABS(cv_mem->cv_h) + ABS(cv_mem->cv_tn)) * cv_mem->cv_uround * 100.0;
  cv_mem->cv_ttol = dVar19;
  uVar9 = (ulong)(uint)cv_mem->cv_nrtfn;
  if (cv_mem->cv_nrtfn < 1) {
    cv_mem->cv_trout = cv_mem->cv_thi;
    cv_mem->cv_tlo = cv_mem->cv_thi;
LAB_0010f553:
    iVar7 = 0;
  }
  else {
    piVar2 = cv_mem->cv_gactive;
    bVar15 = true;
    bVar6 = false;
    iVar7 = 0;
    uVar16 = 0;
    dVar23 = 0.0;
LAB_0010ee08:
    do {
      uVar12 = uVar16 + 1;
      if (piVar2[uVar16] != 0) {
        dVar20 = cv_mem->cv_ghi[uVar16];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          dVar5 = cv_mem->cv_glo[uVar16];
          if ((((0.0 < dVar20) && (dVar5 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar5)))) &&
             (((double)cv_mem->cv_rootdir[uVar16] * dVar5 <= 0.0 &&
              (dVar20 = ABS(dVar20 / (dVar20 - dVar5)), dVar23 < dVar20)))) {
            iVar7 = (int)uVar12 + -1;
            bVar15 = false;
            uVar16 = uVar12;
            dVar23 = dVar20;
            if (uVar9 == uVar12) {
              iVar7 = (int)uVar12 + -1;
              goto LAB_0010efb9;
            }
            goto LAB_0010ee08;
          }
        }
        else if ((double)cv_mem->cv_rootdir[uVar16] * cv_mem->cv_glo[uVar16] <= 0.0) {
          bVar6 = true;
        }
      }
      uVar16 = uVar12;
    } while (uVar12 != uVar9);
    if (bVar15) {
      cv_mem->cv_trout = cv_mem->cv_thi;
      psVar17 = cv_mem->cv_ghi;
      psVar3 = cv_mem->cv_grout;
      uVar16 = 0;
      do {
        psVar3[uVar16] = psVar17[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar9 != uVar16);
      if (bVar6) {
        piVar4 = cv_mem->cv_iroots;
        lVar14 = 0;
        do {
          piVar4[lVar14] = 0;
          if ((((piVar2[lVar14] != 0) && (dVar19 = psVar17[lVar14], dVar19 == 0.0)) &&
              (!NAN(dVar19))) &&
             ((double)cv_mem->cv_rootdir[lVar14] * cv_mem->cv_glo[lVar14] <= 0.0)) {
            piVar4[lVar14] = (uint)(cv_mem->cv_glo[lVar14] <= 0.0) * 2 + -1;
          }
          lVar14 = lVar14 + 1;
          uVar9 = (ulong)cv_mem->cv_nrtfn;
        } while (lVar14 < (long)uVar9);
        goto LAB_0010f4c0;
      }
      bVar6 = true;
LAB_0010f4c2:
      if ((int)uVar9 < 1) {
        cv_mem->cv_tlo = cv_mem->cv_trout;
      }
      else {
        piVar2 = cv_mem->cv_gactive;
        lVar14 = 0;
        do {
          if ((piVar2[lVar14] == 0) &&
             ((cv_mem->cv_grout[lVar14] != 0.0 || (NAN(cv_mem->cv_grout[lVar14]))))) {
            piVar2[lVar14] = 1;
            uVar9 = (ulong)(uint)cv_mem->cv_nrtfn;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar9);
        cv_mem->cv_tlo = cv_mem->cv_trout;
        if (0 < (int)uVar9) {
          psVar17 = cv_mem->cv_glo;
          psVar3 = cv_mem->cv_grout;
          uVar16 = 0;
          do {
            psVar17[uVar16] = psVar3[uVar16];
            uVar16 = uVar16 + 1;
          } while ((uVar9 & 0xffffffff) != uVar16);
        }
      }
      if (bVar6) goto LAB_0010f553;
    }
    else {
LAB_0010efb9:
      dVar23 = cv_mem->cv_tlo;
      dVar20 = cv_mem->cv_thi;
      dVar21 = dVar20 - dVar23;
      dVar5 = ABS(dVar21);
      if (dVar5 <= dVar19) {
LAB_0010f3d2:
        cv_mem->cv_trout = dVar20;
LAB_0010f3da:
        piVar2 = cv_mem->cv_iroots;
        psVar17 = cv_mem->cv_ghi;
        psVar3 = cv_mem->cv_grout;
        piVar4 = cv_mem->cv_gactive;
        lVar14 = 0;
        do {
          dVar19 = psVar17[lVar14];
          psVar3[lVar14] = dVar19;
          piVar2[lVar14] = 0;
          if (piVar4[lVar14] != 0) {
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              dVar23 = cv_mem->cv_glo[lVar14];
            }
            else {
              dVar23 = cv_mem->cv_glo[lVar14];
              if ((double)cv_mem->cv_rootdir[lVar14] * dVar23 <= 0.0) {
                piVar2[lVar14] = (uint)(dVar23 <= 0.0) * 2 + -1;
              }
            }
            if ((((0.0 < dVar19) && (dVar23 < 0.0)) || ((dVar19 < 0.0 && (0.0 < dVar23)))) &&
               ((double)cv_mem->cv_rootdir[lVar14] * dVar23 <= 0.0)) {
              piVar2[lVar14] = (uint)(dVar23 <= 0.0) * 2 + -1;
            }
          }
          lVar14 = lVar14 + 1;
          uVar9 = (ulong)cv_mem->cv_nrtfn;
        } while (lVar14 < (long)uVar9);
LAB_0010f4c0:
        bVar6 = false;
        goto LAB_0010f4c2;
      }
      dVar24 = 1.0;
      dVar22 = 0.5;
      iVar8 = -1;
      iVar18 = 0;
      do {
        if (iVar8 == iVar18) {
          dVar24 = dVar24 * dVar22;
        }
        else {
          dVar24 = 1.0;
        }
        dVar22 = dVar20 - (dVar21 * cv_mem->cv_ghi[iVar7]) /
                          (cv_mem->cv_ghi[iVar7] - cv_mem->cv_glo[iVar7] * dVar24);
        dVar5 = dVar5 / dVar19;
        if (ABS(dVar22 - dVar23) < dVar19 * 0.5) {
          dVar22 = (double)(-(ulong)(5.0 < dVar5) & 0x3fb999999999999a |
                           ~-(ulong)(5.0 < dVar5) & (ulong)(0.5 / dVar5)) * dVar21 + dVar23;
        }
        dVar23 = dVar22;
        if (ABS(dVar20 - dVar22) < dVar19 * 0.5) {
          dVar23 = (double)(-(ulong)(5.0 < dVar5) & 0xbfb999999999999a |
                           ~-(ulong)(5.0 < dVar5) & (ulong)(-0.5 / dVar5)) * dVar21 + dVar20;
        }
        CVodeGetDky(cv_mem,dVar23,0,cv_mem->cv_y);
        iVar8 = (*cv_mem->cv_gfun)(dVar23,cv_mem->cv_y,cv_mem->cv_grout,cv_mem->cv_user_data);
        cv_mem->cv_nge = cv_mem->cv_nge + 1;
        if (iVar8 != 0) {
          return -0xc;
        }
        uVar1 = cv_mem->cv_nrtfn;
        lVar14 = (long)(int)uVar1;
        if (0 < lVar14) {
          bVar15 = true;
          bVar6 = false;
          lVar13 = 0;
          dVar19 = 0.0;
LAB_0010f185:
          do {
            lVar10 = lVar13 + 1;
            if (cv_mem->cv_gactive[lVar13] != 0) {
              psVar17 = cv_mem->cv_grout;
              dVar20 = psVar17[lVar13];
              if ((dVar20 != 0.0) || (NAN(dVar20))) {
                dVar5 = cv_mem->cv_glo[lVar13];
                if ((((0.0 < dVar20) && (dVar5 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar5)))) &&
                   (((double)cv_mem->cv_rootdir[lVar13] * dVar5 <= 0.0 &&
                    (dVar20 = ABS(dVar20 / (dVar20 - dVar5)), dVar19 < dVar20)))) {
                  iVar7 = (int)lVar13;
                  bVar15 = false;
                  lVar13 = lVar10;
                  dVar19 = dVar20;
                  if (lVar10 == lVar14) {
                    iVar7 = (int)lVar10 + -1;
                    goto LAB_0010f306;
                  }
                  goto LAB_0010f185;
                }
              }
              else if ((double)cv_mem->cv_rootdir[lVar13] * cv_mem->cv_glo[lVar13] <= 0.0) {
                bVar6 = true;
              }
            }
            lVar13 = lVar10;
          } while (lVar10 != lVar14);
          if (bVar15) {
            if (!bVar6) {
              cv_mem->cv_tlo = dVar23;
              psVar17 = cv_mem->cv_glo;
              psVar3 = cv_mem->cv_grout;
              lVar13 = 0;
              do {
                psVar17[lVar13] = psVar3[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar14 != lVar13);
              dVar23 = cv_mem->cv_tlo;
              goto LAB_0010f2c5;
            }
            cv_mem->cv_thi = dVar23;
            psVar17 = cv_mem->cv_ghi;
            psVar3 = cv_mem->cv_grout;
            uVar9 = 0;
            do {
              psVar17[uVar9] = psVar3[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
            dVar20 = cv_mem->cv_thi;
            goto LAB_0010f3d2;
          }
          psVar17 = cv_mem->cv_grout;
LAB_0010f306:
          cv_mem->cv_thi = dVar23;
          psVar3 = cv_mem->cv_ghi;
          lVar13 = 0;
          do {
            psVar3[lVar13] = psVar17[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
          dVar23 = cv_mem->cv_tlo;
          dVar20 = cv_mem->cv_thi;
          dVar21 = dVar20 - dVar23;
          dVar5 = ABS(dVar21);
          dVar19 = cv_mem->cv_ttol;
          if (dVar19 < dVar5) {
            iVar11 = 1;
            dVar22 = 0.5;
            goto LAB_0010f366;
          }
          break;
        }
        cv_mem->cv_tlo = dVar23;
LAB_0010f2c5:
        dVar20 = cv_mem->cv_thi;
        dVar19 = cv_mem->cv_ttol;
        dVar21 = dVar20 - dVar23;
        dVar5 = ABS(dVar21);
        if (dVar5 <= dVar19) break;
        iVar11 = 2;
        dVar22 = 2.0;
LAB_0010f366:
        iVar8 = iVar18;
        iVar18 = iVar11;
      } while (dVar19 < dVar5);
      cv_mem->cv_trout = dVar20;
      if (0 < (int)uVar1) goto LAB_0010f3da;
      cv_mem->cv_tlo = cv_mem->cv_trout;
    }
    CVodeGetDky(cv_mem,cv_mem->cv_trout,0,cv_mem->cv_y);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int cvRcheck3(CVodeMem cv_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (cv_mem->cv_taskc == CV_ONE_STEP)
  {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
  }
  if (cv_mem->cv_taskc == CV_NORMAL)
  {
    if ((cv_mem->cv_toutc - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
    {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
    }
    else
    {
      cv_mem->cv_thi = cv_mem->cv_toutc;
      (void)CVodeGetDky(cv_mem, cv_mem->cv_thi, 0, cv_mem->cv_y);
    }
  }

  /* Set ghi = g(thi) and call cvRootfind to search (tlo,thi) for roots. */
  retval = cv_mem->cv_gfun(cv_mem->cv_thi, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  ier = cvRootfind(cv_mem);
  if (ier == CV_RTFUNC_FAIL) { return (CV_RTFUNC_FAIL); }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i] && cv_mem->cv_grout[i] != ZERO)
    {
      cv_mem->cv_gactive[i] = SUNTRUE;
    }
  }
  cv_mem->cv_tlo = cv_mem->cv_trout;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    cv_mem->cv_glo[i] = cv_mem->cv_grout[i];
  }

  /* If no root found, return CV_SUCCESS. */
  if (ier == CV_SUCCESS) { return (CV_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)CVodeGetDky(cv_mem, cv_mem->cv_trout, 0, cv_mem->cv_y);
  return (RTFOUND);
}